

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_EndOfData(VGMPlayer *this)

{
  uint uVar1;
  PLAYER_EVENT_CB p_Var2;
  pointer pCVar3;
  UINT8 UVar4;
  UINT32 UVar5;
  long lVar6;
  size_t curDev;
  ulong uVar7;
  
  UVar5 = (this->_fileHdr).loopOfs;
  if (UVar5 == 0) {
    this->_playState = this->_playState | 2;
    this->_psTrigger = this->_psTrigger | 2;
    p_Var2 = (this->super_PlayerBase)._eventCbFunc;
    if (p_Var2 != (PLAYER_EVENT_CB)0x0) {
      (*p_Var2)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x04',(void *)0x0);
    }
    UVar4 = (this->_playOpts).hardStopOld;
    if ((UVar4 != '\0') &&
       (uVar1 = (this->_fileHdr).fileVer, UVar4 == '\x02' && uVar1 == 0x150 || uVar1 < 0x150)) {
      lVar6 = 0x10;
      for (uVar7 = 0;
          pCVar3 = (this->_devices).
                   super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)(((long)(this->_devices).
                                 super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0xd0);
          uVar7 = uVar7 + 1) {
        (**(code **)(*(long *)((long)(pCVar3->base).resmpl.smplBufs + lVar6 + 0xffffffffffffff98U) +
                    0x28))(*(undefined8 *)
                            ((long)(pCVar3->base).resmpl.smplBufs + lVar6 + 0xffffffffffffff88U));
        lVar6 = lVar6 + 0xd0;
      }
    }
  }
  else {
    this->_curLoop = this->_curLoop + 1;
    p_Var2 = (this->super_PlayerBase)._eventCbFunc;
    if (p_Var2 != (PLAYER_EVENT_CB)0x0) {
      UVar4 = (*p_Var2)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x03',
                        &this->_curLoop);
      if (UVar4 == '\x01') {
        this->_playState = this->_playState | 2;
        this->_psTrigger = this->_psTrigger | 2;
        return;
      }
      UVar5 = (this->_fileHdr).loopOfs;
    }
    this->_filePos = UVar5;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_EndOfData(void)
{
	if (! _fileHdr.loopOfs)
	{
		_playState |= PLAYSTATE_END;
		_psTrigger |= PLAYSTATE_END;
		if (_eventCbFunc != NULL)
			_eventCbFunc(this, _eventCbParam, PLREVT_END, NULL);
		
		if (_playOpts.hardStopOld)
		{
			UINT8 doStop = 0x00;
			doStop |= (_fileHdr.fileVer < 0x150) << 0;
			doStop |= (_fileHdr.fileVer == 0x150 && _playOpts.hardStopOld == 2) << 1;
			if (doStop)
			{
				size_t curDev;
				for (curDev = 0; curDev < _devices.size(); curDev ++)
				{
					DEV_INFO* devInf = &_devices[curDev].base.defInf;
					devInf->devDef->Reset(devInf->dataPtr);
				}
			}
		}
	}
	else
	{
		_curLoop ++;
		if (_eventCbFunc != NULL)
		{
			UINT8 retVal;
			
			retVal = _eventCbFunc(this, _eventCbParam, PLREVT_LOOP, &_curLoop);
			if (retVal == 0x01)
			{
				_playState |= PLAYSTATE_END;
				_psTrigger |= PLAYSTATE_END;
				return;
			}
		}
		_filePos = _fileHdr.loopOfs;
	}
	
	return;
}